

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_Iterator::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  char cVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Iterator *pIVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  TemplateDictionaryPeer farm_peer;
  TemplateString local_1f8;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  TemplateDictionary farm;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  TemplateString local_90;
  TemplateString local_70;
  TemplateString local_50;
  
  ctemplate::TemplateString::TemplateString(&local_1f8,"Farm");
  ctemplate::TemplateDictionary::TemplateDictionary(&farm,&local_1f8,(UnsafeArena *)0x0);
  farm_peer.dict_ = &farm;
  ctemplate::TemplateString::TemplateString(&local_50,"BARN");
  TVar1.length_ = local_50.length_;
  TVar1.ptr_ = local_50.ptr_;
  TVar1.is_immutable_ = local_50.is_immutable_;
  TVar1._17_7_ = local_50._17_7_;
  TVar1.id_ = local_50.id_;
  lVar11 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_70,"POND");
  TVar2.length_ = local_70.length_;
  TVar2.ptr_ = local_70.ptr_;
  TVar2.is_immutable_ = local_70.is_immutable_;
  TVar2._17_7_ = local_70._17_7_;
  TVar2.id_ = local_70.id_;
  lVar12 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  ctemplate::TemplateString::TemplateString(&local_90,"POND");
  TVar3.length_ = local_90.length_;
  TVar3.ptr_ = local_90.ptr_;
  TVar3.is_immutable_ = local_90.is_immutable_;
  TVar3._17_7_ = local_90._17_7_;
  TVar3.id_ = local_90.id_;
  lVar13 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_b0,"POND");
  TVar4.length_ = local_b0.length_;
  TVar4.ptr_ = local_b0.ptr_;
  TVar4.is_immutable_ = local_b0.is_immutable_;
  TVar4._17_7_ = local_b0._17_7_;
  TVar4.id_ = local_b0.id_;
  lVar14 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar4);
  ctemplate::TemplateString::TemplateString(&local_d0,"FLOWERS");
  TVar5.length_ = local_d0.length_;
  TVar5.ptr_ = local_d0.ptr_;
  TVar5.is_immutable_ = local_d0.is_immutable_;
  TVar5._17_7_ = local_d0._17_7_;
  TVar5.id_ = local_d0.id_;
  lVar15 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
  ctemplate::TemplateString::TemplateString(&local_f0,"FLOWERS");
  TVar6.length_ = local_f0.length_;
  TVar6.ptr_ = local_f0.ptr_;
  TVar6.is_immutable_ = local_f0.is_immutable_;
  TVar6._17_7_ = local_f0._17_7_;
  TVar6.id_ = local_f0.id_;
  local_1c8 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar6);
  ctemplate::TemplateString::TemplateString(&local_110,"FLOWERS");
  TVar7.length_ = local_110.length_;
  TVar7.ptr_ = local_110.ptr_;
  TVar7.is_immutable_ = local_110.is_immutable_;
  TVar7._17_7_ = local_110._17_7_;
  TVar7.id_ = local_110.id_;
  local_1d0 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar7);
  ctemplate::TemplateString::TemplateString(&local_130,"WHEAT");
  TVar8.length_ = local_130.length_;
  TVar8.ptr_ = local_130.ptr_;
  TVar8.is_immutable_ = local_130.is_immutable_;
  TVar8._17_7_ = local_130._17_7_;
  TVar8.id_ = local_130.id_;
  local_1d8 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar8);
  ctemplate::TemplateString::TemplateString(&local_150,"CORN");
  TVar9.length_ = local_150.length_;
  TVar9.ptr_ = local_150.ptr_;
  TVar9.is_immutable_ = local_150.is_immutable_;
  TVar9._17_7_ = local_150._17_7_;
  TVar9.id_ = local_150.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar9);
  ctemplate::TemplateString::TemplateString(&local_1f8,"BARN");
  pIVar16 = ctemplate::TemplateDictionaryPeer::CreateTemplateIterator(&farm_peer,&local_1f8);
  cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
  if (cVar10 == '\0') {
    pcVar18 = "barns->HasNext()";
  }
  else {
    lVar17 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
    if (lVar17 != lVar11) {
      pcVar18 = "&barns->Next()";
      pcVar19 = "grey_barn";
      goto LAB_0010fe3f;
    }
    cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
    if (cVar10 == '\0') {
      if (pIVar16->it_ != (Iterator *)0x0) {
        (**(code **)(*(long *)pIVar16->it_ + 8))();
      }
      operator_delete(pIVar16);
      ctemplate::TemplateString::TemplateString(&local_1f8,"POND");
      pIVar16 = ctemplate::TemplateDictionaryPeer::CreateTemplateIterator(&farm_peer,&local_1f8);
      cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
      if (cVar10 != '\0') {
        lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
        if (lVar11 == lVar12) {
          cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
          if (cVar10 == '\0') goto LAB_0010fc27;
          lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
          if (lVar11 == lVar13) {
            cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
            if (cVar10 == '\0') goto LAB_0010fc27;
            lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
            if (lVar11 == lVar14) {
              cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
              if (cVar10 != '\0') {
                pcVar18 = "!(ponds->HasNext())";
                goto LAB_0010fe94;
              }
              if (pIVar16->it_ != (Iterator *)0x0) {
                (**(code **)(*(long *)pIVar16->it_ + 8))();
              }
              operator_delete(pIVar16);
              ctemplate::TemplateString::TemplateString(&local_1f8,"FLOWERS");
              pIVar16 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator
                                  (&farm_peer,&local_1f8);
              cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
              if (cVar10 == '\0') {
LAB_0010fc44:
                pcVar18 = "flowers->HasNext()";
                goto LAB_0010fe94;
              }
              lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
              if (lVar11 == lVar15) {
                cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                if (cVar10 == '\0') goto LAB_0010fc44;
                lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
                if (lVar11 == local_1c8) {
                  cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                  if (cVar10 == '\0') goto LAB_0010fc44;
                  lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
                  if (lVar11 == local_1d0) {
                    cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                    if (cVar10 == '\0') {
                      if (pIVar16->it_ != (Iterator *)0x0) {
                        (**(code **)(*(long *)pIVar16->it_ + 8))();
                      }
                      operator_delete(pIVar16);
                      ctemplate::TemplateString::TemplateString(&local_1f8,"WHEAT");
                      pIVar16 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator
                                          (&farm_peer,&local_1f8);
                      cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                      if (cVar10 == '\0') {
                        pcVar18 = "crop->HasNext()";
                      }
                      else {
                        lVar11 = (**(code **)(*(long *)pIVar16->it_ + 0x18))();
                        if (lVar11 != local_1d8) {
                          pcVar18 = "&crop->Next()";
                          pcVar19 = "wheat";
                          goto LAB_0010fe3f;
                        }
                        cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                        if (cVar10 == '\0') {
                          if (pIVar16->it_ != (Iterator *)0x0) {
                            (**(code **)(*(long *)pIVar16->it_ + 8))();
                          }
                          operator_delete(pIVar16);
                          ctemplate::TemplateString::TemplateString(&local_1f8,"CORN");
                          pIVar16 = ctemplate::TemplateDictionaryPeer::CreateSectionIterator
                                              (&farm_peer,&local_1f8);
                          cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                          if (cVar10 == '\0') {
                            pcVar18 = "corn_crop->HasNext()";
                          }
                          else {
                            (**(code **)(*(long *)pIVar16->it_ + 0x18))();
                            cVar10 = (**(code **)(*(long *)pIVar16->it_ + 0x10))();
                            if (cVar10 == '\0') {
                              if (pIVar16->it_ != (Iterator *)0x0) {
                                (**(code **)(*(long *)pIVar16->it_ + 8))();
                              }
                              operator_delete(pIVar16);
                              ctemplate::TemplateDictionary::~TemplateDictionary(&farm);
                              return;
                            }
                            pcVar18 = "!(corn_crop->HasNext())";
                          }
                        }
                        else {
                          pcVar18 = "!(crop->HasNext())";
                        }
                      }
                    }
                    else {
                      pcVar18 = "!(flowers->HasNext())";
                    }
                    goto LAB_0010fe94;
                  }
                  pcVar18 = "&flowers->Next()";
                  pcVar19 = "daisies";
                }
                else {
                  pcVar18 = "&flowers->Next()";
                  pcVar19 = "lilacs";
                }
              }
              else {
                pcVar18 = "&flowers->Next()";
                pcVar19 = "lillies";
              }
            }
            else {
              pcVar18 = "&ponds->Next()";
              pcVar19 = "irrigation_pond";
            }
          }
          else {
            pcVar18 = "&ponds->Next()";
            pcVar19 = "cattle_pond";
          }
        }
        else {
          pcVar18 = "&ponds->Next()";
          pcVar19 = "duck_pond";
        }
LAB_0010fe3f:
        fprintf(_stderr,"Check failed: %s %s %s\n",pcVar18,"==",pcVar19);
        goto LAB_0010fe9b;
      }
LAB_0010fc27:
      pcVar18 = "ponds->HasNext()";
    }
    else {
      pcVar18 = "!(barns->HasNext())";
    }
  }
LAB_0010fe94:
  fprintf(_stderr,"Check failed: %s\n",pcVar18);
LAB_0010fe9b:
  exit(1);
}

Assistant:

TEST(TemplateDictionary, Iterator) {
  // Build up a nice community of TemplateDictionaries.
  TemplateDictionary farm("Farm");
  TemplateDictionaryPeer farm_peer(&farm);
  TemplateDictionaryInterface* grey_barn =
      farm.AddIncludeDictionary("BARN");
  TemplateDictionaryInterface* duck_pond =
      farm.AddIncludeDictionary("POND");
  TemplateDictionaryInterface* cattle_pond =
      farm.AddIncludeDictionary("POND");
  TemplateDictionaryInterface* irrigation_pond =
      farm.AddIncludeDictionary("POND");

  // A section name with repeated sections
  TemplateDictionaryInterface* lillies = farm.AddSectionDictionary("FLOWERS");
  TemplateDictionaryInterface* lilacs = farm.AddSectionDictionary("FLOWERS");
  TemplateDictionaryInterface* daisies = farm.AddSectionDictionary("FLOWERS");
  // A section name with one repeat
  TemplateDictionaryInterface* wheat = farm.AddSectionDictionary("WHEAT");
  // A section name, just shown
  farm.ShowSection("CORN");

  // Check that the iterators expose all of the dictionaries.
  TemplateDictionaryPeer::Iterator* barns =
      farm_peer.CreateTemplateIterator("BARN");
  EXPECT_TRUE(barns->HasNext());
  EXPECT_EQ(&barns->Next(), grey_barn);
  EXPECT_FALSE(barns->HasNext());
  delete barns;

  TemplateDictionaryPeer::Iterator* ponds =
      farm_peer.CreateTemplateIterator("POND");
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), duck_pond);
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), cattle_pond);
  EXPECT_TRUE(ponds->HasNext());
  EXPECT_EQ(&ponds->Next(), irrigation_pond);
  EXPECT_FALSE(ponds->HasNext());
  delete ponds;

  TemplateDictionaryPeer::Iterator* flowers =
      farm_peer.CreateSectionIterator("FLOWERS");
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), lillies);
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), lilacs);
  EXPECT_TRUE(flowers->HasNext());
  EXPECT_EQ(&flowers->Next(), daisies);
  EXPECT_FALSE(flowers->HasNext());
  delete flowers;

  TemplateDictionaryPeer::Iterator* crop =
      farm_peer.CreateSectionIterator("WHEAT");
  EXPECT_TRUE(crop->HasNext());
  EXPECT_EQ(&crop->Next(), wheat);
  EXPECT_FALSE(crop->HasNext());
  delete crop;

  TemplateDictionaryPeer::Iterator* corn_crop =
      farm_peer.CreateSectionIterator("CORN");
  EXPECT_TRUE(corn_crop->HasNext());
  EXPECT_TRUE(&corn_crop->Next());  // ShowSection doesn't give us the dict back
  EXPECT_FALSE(corn_crop->HasNext());
  delete corn_crop;
}